

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvisualmatrix.cpp
# Opt level: O0

void VisualMatrixDX<float>(TPZFMatrix<float> *matrix,string *outfilename)

{
  _Ios_Openmode _Var1;
  int64_t iVar2;
  char *pcVar3;
  ostream *poVar4;
  float *pfVar5;
  string *in_RSI;
  TPZBaseMatrix *in_RDI;
  ofstream out;
  int j;
  int i;
  int neltotal;
  int nely;
  int nelx;
  int64_t in_stack_fffffffffffffd10;
  int64_t in_stack_fffffffffffffd18;
  TPZFMatrix<float> *in_stack_fffffffffffffd20;
  long local_228 [64];
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  string *local_10;
  TPZBaseMatrix *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar2 = TPZBaseMatrix::Cols(in_RDI);
  local_14 = (int)iVar2;
  iVar2 = TPZBaseMatrix::Rows(local_8);
  local_18 = (int)iVar2;
  local_1c = local_14 * local_18;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var1 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream((ostream *)local_228,pcVar3,_Var1);
  std::operator<<((ostream *)local_228,"# Graphical Visualization of Matrix.\n");
  std::operator<<((ostream *)local_228,
                  "# Positions as the indexes of the matrix, beginning by column.\n");
  std::operator<<((ostream *)local_228,
                  "# The number of elements in x direction correspond to the number of the columns of the matrix.\n"
                 );
  std::operator<<((ostream *)local_228,
                  "# The number of elements in y direction correspond to the number of the rows of the matrix.\n"
                 );
  poVar4 = std::operator<<((ostream *)local_228,"object 1 class gridpositions counts ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14 + 1);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_18 + 1);
  std::operator<<(poVar4,"\n");
  std::operator<<((ostream *)local_228,"origin 0. 0.\n");
  std::operator<<((ostream *)local_228,"delta 1. 0.\n");
  std::operator<<((ostream *)local_228,"delta 0. 1.\n");
  poVar4 = std::operator<<((ostream *)local_228,"attribute \"dep\" string \"positions\"");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)local_228,"\n");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)local_228,"object 2 class gridconnections counts ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14 + 1);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_18 + 1);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)local_228,"attribute \"element type\" string \"quads\"");
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)local_228,"attribute \"ref\" string \"positions\"");
  std::operator<<(poVar4,"\n");
  std::ios_base::precision((ios_base *)((long)local_228 + *(long *)(local_228[0] + -0x18)),5);
  poVar4 = std::operator<<((ostream *)local_228,"object 3 class array type float rank 0 items ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1c);
  std::operator<<(poVar4," data follows\n");
  for (local_20 = 0; local_20 < local_14; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < local_18; local_24 = local_24 + 1) {
      pfVar5 = TPZFMatrix<float>::operator()
                         (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                          in_stack_fffffffffffffd10);
      poVar4 = (ostream *)std::ostream::operator<<(local_228,*pfVar5);
      std::operator<<(poVar4,"\n");
    }
  }
  poVar4 = std::operator<<((ostream *)local_228,"attribute \"dep\" string \"connections\" ");
  poVar4 = std::operator<<(poVar4,"\n");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)local_228,"\n");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  std::operator<<((ostream *)local_228,"object 4 class field\n");
  std::operator<<((ostream *)local_228,"component \"data\" value 3\n");
  std::operator<<((ostream *)local_228,"component \"positions\" value 1\n");
  std::operator<<((ostream *)local_228,"component \"connections\" value 2\n");
  poVar4 = std::operator<<((ostream *)local_228,"attribute \"name\" string \"Matrix\"");
  poVar4 = std::operator<<(poVar4,"\n");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  std::operator<<((ostream *)local_228,"\n");
  poVar4 = std::operator<<((ostream *)local_228,"end\n");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  std::ofstream::close();
  poVar4 = std::operator<<((ostream *)&std::cout,"Data Explorer file ");
  poVar4 = std::operator<<(poVar4,local_10);
  std::operator<<(poVar4," was created with success!\n");
  std::ofstream::~ofstream(local_228);
  return;
}

Assistant:

void VisualMatrixDX(TPZFMatrix<TVar> & matrix, const std::string &outfilename)
{
	const int nelx = matrix.Cols();
	const int nely = matrix.Rows();
	const int neltotal = nelx * nely;
	int i,j;
	ofstream out(outfilename.c_str(), ofstream::out | ofstream::binary); // binary prevents translation of "\n" under windows
	out << "# Graphical Visualization of Matrix.\n" ; 
	out << "# Positions as the indexes of the matrix, beginning by column.\n" ;
	out << "# The number of elements in x direction correspond to the number of the columns of the matrix.\n" ;
	out << "# The number of elements in y direction correspond to the number of the rows of the matrix.\n" ;
	
	out  << "object 1 class gridpositions counts " << nelx+1 << " " << nely +1 << "\n";
	out << "origin 0. 0.\n" ;
	out << "delta 1. 0.\n" ;
	out << "delta 0. 1.\n" ;
	out << "attribute \"dep\" string \"positions\"" << "\n" ;
	out << "\n" << std::flush;
	
	
	out << "object 2 class gridconnections counts " << nelx+1 << " " << nely +1 << "\n" ;
	
 	out << "attribute \"element type\" string \"quads\"" << "\n" ;
	out << "attribute \"ref\" string \"positions\"" << "\n" ;
	
	out.precision(5);
	out  << "object 3 class array type float rank 0 items " << neltotal << " data follows\n" ;
	for (i = 0; i < nelx; i++) {
		for(j=0; j< nely ; j++) out << matrix(i,j) << "\n" ;
	}
	out << "attribute \"dep\" string \"connections\" " << "\n" << std::flush;
	out << "\n" << std::flush;
	
	out << "object 4 class field\n" ;
	out << "component \"data\" value 3\n" ;
	out << "component \"positions\" value 1\n" ;
	out << "component \"connections\" value 2\n" ;
	out << "attribute \"name\" string \"Matrix\"" << "\n" << std::flush;
	
	out << "\n" ;
	out << "end\n" << std::flush;
	
	out.close();
	
	cout << "Data Explorer file " << outfilename << " was created with success!\n";
}